

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall StrTest_Convert_Test::TestBody(StrTest_Convert_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_1;
  string s;
  AssertionResult gtest_ar;
  Date *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  char (*in_stack_ffffffffffffff28) [3];
  Date *this_00;
  char *in_stack_ffffffffffffff30;
  string *actual_expression;
  char *in_stack_ffffffffffffff38;
  int line;
  undefined7 in_stack_ffffffffffffff40;
  Type type;
  AssertHelper *in_stack_ffffffffffffff50;
  AssertionResult local_a0;
  Date local_8c;
  string local_80 [24];
  Message *in_stack_ffffffffffffff98;
  AssertHelper *in_stack_ffffffffffffffa0;
  string local_38 [32];
  AssertionResult local_18;
  
  type = (Type)((ulong)local_38 >> 0x20);
  str<int>(&in_stack_ffffffffffffff18->year_);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  std::__cxx11::string::~string(local_38);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff38 =
         testing::AssertionResult::failure_message((AssertionResult *)0x17c507);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff50,type,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff40),
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),in_stack_ffffffffffffff30);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    testing::Message::~Message((Message *)0x17c564);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17c5bc);
  this_00 = &local_8c;
  Date::Date(this_00,0x7dc,0xc,9);
  actual_expression = local_80;
  str<Date>(in_stack_ffffffffffffff18);
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            (in_stack_ffffffffffffff38,(char *)actual_expression,(char (*) [10])this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  line = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff50);
    testing::AssertionResult::failure_message((AssertionResult *)0x17c68d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff50,type,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff40),line
               ,(char *)actual_expression);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff20));
    testing::Message::~Message((Message *)0x17c6d9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17c725);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

TEST(StrTest, Convert) {
  EXPECT_EQ("42", str(42));
  std::string s = str(Date(2012, 12, 9));
  EXPECT_EQ("2012-12-9", s);
}